

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

QDomNodePrivate * __thiscall
QDomNamedNodeMapPrivate::setNamedItem(QDomNamedNodeMapPrivate *this,QDomNodePrivate *arg)

{
  int iVar1;
  undefined4 extraout_var;
  QDomNodePrivate *pQVar2;
  long in_FS_OFFSET;
  iterator local_60;
  QArrayDataPointer<char16_t> local_48;
  QDomNodePrivate *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QDomNodePrivate *)0x0;
  local_30 = arg;
  if ((arg != (QDomNodePrivate *)0x0) && (this->readonly == false)) {
    if (this->appendToParent == true) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        iVar1 = (*this->parent->_vptr_QDomNodePrivate[7])(this->parent,arg);
        return (QDomNodePrivate *)CONCAT44(extraout_var,iVar1);
      }
      goto LAB_0010f81b;
    }
    local_48.d = (arg->name).d.d;
    local_48.ptr = (arg->name).d.ptr;
    local_48.size = (arg->name).d.size;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pQVar2 = QMultiHash<QString,_QDomNodePrivate_*>::value(&this->map,(QString *)&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    LOCK();
    (arg->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (arg->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_48.d = (local_30->name).d.d;
    local_48.ptr = (local_30->name).d.ptr;
    local_48.size = (local_30->name).d.size;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QMultiHash<QString,QDomNodePrivate*>::emplace<QDomNodePrivate*const&>
              (&local_60,&this->map,(QString *)&local_48,&local_30);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar2;
  }
LAB_0010f81b:
  __stack_chk_fail();
}

Assistant:

QDomNodePrivate* QDomNamedNodeMapPrivate::setNamedItem(QDomNodePrivate* arg)
{
    if (readonly || !arg)
        return nullptr;

    if (appendToParent)
        return parent->appendChild(arg);

    QDomNodePrivate *n = map.value(arg->nodeName());
    // We take a reference
    arg->ref.ref();
    map.insert(arg->nodeName(), arg);
    return n;
}